

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_member_reference_abi_cxx11_
          (CompilerGLSL *this,uint32_t param_1,SPIRType *type,uint32_t index,bool param_4)

{
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  undefined3 in_register_00000081;
  byte in_R9B;
  undefined1 local_50 [43];
  bool param_4_local;
  uint32_t index_local;
  SPIRType *type_local;
  SPIRType *pSStack_18;
  uint32_t param_1_local;
  CompilerGLSL *this_local;
  
  local_50._36_4_ = CONCAT31(in_register_00000081,param_4);
  pSStack_18 = (SPIRType *)CONCAT44(in_register_00000034,param_1);
  register0x00000008 = (Variant *)CONCAT44(in_register_0000000c,index);
  type_local._4_4_ = SUB84(type,0);
  local_50[0x23] = in_R9B & 1;
  this_local = this;
  to_member_name_abi_cxx11_((CompilerGLSL *)local_50,pSStack_18,index);
  join<char_const(&)[2],std::__cxx11::string>
            ((spirv_cross *)this,(char (*) [2])0x5b4654,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  ::std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

string CompilerGLSL::to_member_reference(uint32_t, const SPIRType &type, uint32_t index, bool)
{
	return join(".", to_member_name(type, index));
}